

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetApproxQuantileListAggregateFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  NotImplementedException *pNVar2;
  LogicalType *in_RDX;
  string local_40;
  
  switch(type->id_) {
  case TINYINT:
    GetTypedApproxQuantileListAggregateFunction<signed_char,signed_char>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INTEGER:
  case DATE:
  case TIME:
switchD_00dfda8c_caseD_d:
    GetTypedApproxQuantileListAggregateFunction<int,int>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case BIGINT:
  case TIMESTAMP:
  case TIMESTAMP_TZ:
switchD_00dfda8c_caseD_e:
    GetTypedApproxQuantileListAggregateFunction<long,long>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP_NS:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
  case UBIGINT:
  case TIMESTAMP_TZ|SQLNULL:
switchD_00dfda8c_caseD_11:
    pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented approximate quantile list aggregate","");
    NotImplementedException::NotImplementedException(pNVar2,&local_40);
    __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case DECIMAL:
    PVar1 = type->physical_type_;
    if (UINT64 < PVar1) {
      if (PVar1 != INT64) {
        if (PVar1 != INT128) goto LAB_00dfdb76;
        goto LAB_00dfdb56;
      }
      goto switchD_00dfda8c_caseD_e;
    }
    if (PVar1 != INT16) {
      if (PVar1 != INT32) {
LAB_00dfdb76:
        pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented approximate quantile list decimal aggregate",
                   "");
        NotImplementedException::NotImplementedException(pNVar2,&local_40);
        __cxa_throw(pNVar2,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_00dfda8c_caseD_d;
    }
  case SMALLINT:
    GetTypedApproxQuantileListAggregateFunction<short,short>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case FLOAT:
    GetTypedApproxQuantileListAggregateFunction<float,float>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DOUBLE:
    GetTypedApproxQuantileListAggregateFunction<double,double>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case TIME_TZ:
    GetTypedApproxQuantileListAggregateFunction<duckdb::dtime_tz_t,duckdb::dtime_tz_t>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (type->id_ != HUGEINT) goto switchD_00dfda8c_caseD_11;
LAB_00dfdb56:
    GetTypedApproxQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetApproxQuantileListAggregateFunction(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
		return GetTypedApproxQuantileListAggregateFunction<int8_t, int8_t>(type);
	case LogicalTypeId::SMALLINT:
		return GetTypedApproxQuantileListAggregateFunction<int16_t, int16_t>(type);
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIME:
		return GetTypedApproxQuantileListAggregateFunction<int32_t, int32_t>(type);
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
		return GetTypedApproxQuantileListAggregateFunction<int64_t, int64_t>(type);
	case LogicalTypeId::TIME_TZ:
		//	Not binary comparable
		return GetTypedApproxQuantileListAggregateFunction<dtime_tz_t, dtime_tz_t>(type);
	case LogicalTypeId::HUGEINT:
		return GetTypedApproxQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
	case LogicalTypeId::FLOAT:
		return GetTypedApproxQuantileListAggregateFunction<float, float>(type);
	case LogicalTypeId::DOUBLE:
		return GetTypedApproxQuantileListAggregateFunction<double, double>(type);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return GetTypedApproxQuantileListAggregateFunction<int16_t, int16_t>(type);
		case PhysicalType::INT32:
			return GetTypedApproxQuantileListAggregateFunction<int32_t, int32_t>(type);
		case PhysicalType::INT64:
			return GetTypedApproxQuantileListAggregateFunction<int64_t, int64_t>(type);
		case PhysicalType::INT128:
			return GetTypedApproxQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
		default:
			throw NotImplementedException("Unimplemented approximate quantile list decimal aggregate");
		}
	default:
		throw NotImplementedException("Unimplemented approximate quantile list aggregate");
	}
}